

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall
rtb::Filter::Filter<double>::Filter(Filter<double> *this,TransferFunction<double> *tf)

{
  size_t sVar1;
  allocator<std::complex<double>_> local_51;
  complex<double> local_50;
  allocator<std::complex<double>_> local_39;
  complex<double> local_38 [2];
  TransferFunction<double> *local_18;
  TransferFunction<double> *tf_local;
  Filter<double> *this_local;
  
  local_18 = tf;
  tf_local = &this->tf_;
  TransferFunction<double>::TransferFunction(&this->tf_,tf);
  sVar1 = TransferFunction<double>::getNumeratorSize(&this->tf_);
  std::complex<double>::complex(local_38,0.0,0.0);
  std::allocator<std::complex<double>_>::allocator(&local_39);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->x_,sVar1,local_38,&local_39);
  std::allocator<std::complex<double>_>::~allocator(&local_39);
  sVar1 = TransferFunction<double>::getDenominatorSize(&this->tf_);
  std::complex<double>::complex(&local_50,0.0,0.0);
  std::allocator<std::complex<double>_>::allocator(&local_51);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->y_,sVar1,&local_50,&local_51);
  std::allocator<std::complex<double>_>::~allocator(&local_51);
  this->count_ = 0;
  sVar1 = TransferFunction<double>::getDenominatorSize(&this->tf_);
  this->n_ = sVar1;
  sVar1 = TransferFunction<double>::getNumeratorSize(&this->tf_);
  this->m_ = sVar1;
  return;
}

Assistant:

Filter<T>::Filter(const TransferFunction<T>& tf) :
            tf_(tf),
            count_(0),
            y_(tf_.getDenominatorSize(), .0),
            x_(tf_.getNumeratorSize(), .0),
            n_(tf_.getDenominatorSize()),
            m_(tf_.getNumeratorSize())  { }